

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
::operator*(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *w)

{
  pointer pnVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  int *piVar8;
  pointer pnVar9;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar10;
  long lVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  byte bVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_130;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  x;
  
  bVar19 = 0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::StableSum(&x);
  iVar4 = (w->super_IdxSet).num;
  if (0 < iVar4 && 0 < *(int *)(this + 8)) {
    uVar17 = (ulong)(iVar4 - 1);
    uVar15 = (ulong)(*(int *)(this + 8) - 1);
    lVar3 = *(long *)(this + 0x10);
    piVar5 = (int *)(lVar3 + uVar15 * 4);
    piVar2 = (w->super_IdxSet).idx;
    piVar8 = piVar2 + uVar17;
    do {
      iVar4 = *piVar5;
LAB_00431746:
      iVar7 = *piVar8;
      uVar15 = (ulong)(int)uVar15;
      while( true ) {
        iVar16 = (int)uVar17;
        lVar11 = (long)iVar16;
        iVar14 = (int)uVar15;
        if ((iVar14 == 0) || (iVar16 == 0)) goto LAB_0043186c;
        if (iVar4 == iVar7) break;
        if (iVar4 <= iVar7) goto LAB_00431776;
        uVar15 = uVar15 - 1;
        iVar4 = *(int *)(lVar3 + (long)(iVar14 + -1) * 4);
      }
      lVar6 = (long)iVar4;
      lVar3 = *(long *)(this + 0x20);
      pnVar1 = (w->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar9 = pnVar1 + lVar6;
      pcVar12 = &local_130;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pcVar12->data)._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
        pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar19 * -2 + 1) * 4);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
      }
      local_130.exp = pnVar1[lVar6].m_backend.exp;
      local_130.neg = pnVar1[lVar6].m_backend.neg;
      local_130.fpclass = pnVar1[lVar6].m_backend.fpclass;
      local_130.prec_elem = pnVar1[lVar6].m_backend.prec_elem;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar3 + lVar6 * 0x80),
                 &local_130);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                ((cpp_dec_float<200U,_int,_void> *)&x,&result.m_backend);
      uVar15 = (ulong)(iVar14 - 1U);
      lVar3 = *(long *)(this + 0x10);
      piVar5 = (int *)(lVar3 + (long)(int)(iVar14 - 1U) * 4);
      piVar2 = (w->super_IdxSet).idx;
      uVar17 = (ulong)(iVar16 - 1);
      piVar8 = piVar2 + (long)iVar16 + -1;
    } while( true );
  }
LAB_0043191a:
  pSVar10 = &x;
  pnVar13 = __return_storage_ptr__;
  for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pnVar13->m_backend).data._M_elems[0] = (pSVar10->sum).m_backend.data._M_elems[0];
    pSVar10 = (StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((long)pSVar10 + ((ulong)bVar19 * -2 + 1) * 4);
    pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar13 + ((ulong)bVar19 * -2 + 1) * 4);
  }
  (__return_storage_ptr__->m_backend).exp = x.sum.m_backend.exp;
  (__return_storage_ptr__->m_backend).neg = x.sum.m_backend.neg;
  (__return_storage_ptr__->m_backend).fpclass = x.sum.m_backend.fpclass;
  (__return_storage_ptr__->m_backend).prec_elem = x.sum.m_backend.prec_elem;
  return __return_storage_ptr__;
LAB_0043186c:
  while ((bVar18 = uVar15 != 0, uVar15 = uVar15 - 1, bVar18 && (iVar4 != iVar7))) {
    iVar4 = *(int *)(lVar3 + uVar15 * 4);
  }
  while ((bVar18 = lVar11 != 0, lVar11 = lVar11 + -1, bVar18 && (iVar4 != iVar7))) {
    iVar7 = piVar2[lVar11];
  }
  if (iVar4 == iVar7) {
    lVar6 = (long)iVar4;
    lVar3 = *(long *)(this + 0x20);
    pnVar1 = (w->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar9 = pnVar1 + lVar6;
    pcVar12 = &local_130;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pcVar12->data)._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
      pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar19 * -2 + 1) * 4);
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
    }
    local_130.exp = pnVar1[lVar6].m_backend.exp;
    local_130.neg = pnVar1[lVar6].m_backend.neg;
    local_130.fpclass = pnVar1[lVar6].m_backend.fpclass;
    local_130.prec_elem = pnVar1[lVar6].m_backend.prec_elem;
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 0x1c;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems[0xe] = 0;
    result.m_backend.data._M_elems[0xf] = 0;
    result.m_backend.data._M_elems[0x10] = 0;
    result.m_backend.data._M_elems[0x11] = 0;
    result.m_backend.data._M_elems[0x12] = 0;
    result.m_backend.data._M_elems[0x13] = 0;
    result.m_backend.data._M_elems[0x14] = 0;
    result.m_backend.data._M_elems[0x15] = 0;
    result.m_backend.data._M_elems[0x16] = 0;
    result.m_backend.data._M_elems[0x17] = 0;
    result.m_backend.data._M_elems[0x18] = 0;
    result.m_backend.data._M_elems[0x19] = 0;
    result.m_backend.data._M_elems._104_5_ = 0;
    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar3 + lVar6 * 0x80),&local_130
              );
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
              ((cpp_dec_float<200U,_int,_void> *)&x,&result.m_backend);
  }
  goto LAB_0043191a;
LAB_00431776:
  uVar17 = (ulong)(iVar16 - 1);
  piVar8 = piVar2 + (long)iVar16 + -1;
  goto LAB_00431746;
}

Assistant:

R operator*(const SSVectorBase<S>& w)
   {
      setup();

      StableSum<R> x;
      int i = size() - 1;
      int j = w.size() - 1;

      // both *this and w non-zero vectors?
      if(i >= 0 && j >= 0)
      {
         int vi = index(i);
         int wj = w.index(j);

         while(i != 0 && j != 0)
         {
            if(vi == wj)
            {
               x += VectorBase<R>::val[vi] * R(w.val[wj]);
               vi = index(--i);
               wj = w.index(--j);
            }
            else if(vi > wj)
               vi = index(--i);
            else
               wj = w.index(--j);
         }

         /* check remaining indices */

         while(i != 0 && vi != wj)
            vi = index(--i);

         while(j != 0 && vi != wj)
            wj = w.index(--j);

         if(vi == wj)
            x += VectorBase<R>::val[vi] * R(w.val[wj]);
      }

      return x;
   }